

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRandom.h
# Opt level: O0

void __thiscall HighsRandom::initialise(HighsRandom *this,HighsUInt seed)

{
  u64 uVar1;
  uint in_ESI;
  ulong *in_RDI;
  
  *in_RDI = (ulong)in_ESI;
  do {
    uVar1 = HighsHashHelpers::pair_hash<0>((u32)*in_RDI,(u32)(*in_RDI >> 0x20));
    *in_RDI = uVar1;
    uVar1 = HighsHashHelpers::pair_hash<1>((u32)(*in_RDI >> 0x20),in_ESI);
    *in_RDI = uVar1 >> 0x20 ^ *in_RDI;
  } while (*in_RDI == 0);
  return;
}

Assistant:

void initialise(HighsUInt seed = 0) {
    state = seed;
    do {
      state = HighsHashHelpers::pair_hash<0>(static_cast<uint32_t>(state),
                                             state >> 32);
      state ^= (HighsHashHelpers::pair_hash<1>(state >> 32, seed) >> 32);
    } while (state == 0);
  }